

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

void Vta_ObjPreds(Vta_Man_t *p,Vta_Obj_t *pThis,Gia_Obj_t *pObj,Vta_Obj_t **ppThis0,
                 Vta_Obj_t **ppThis1)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  Vta_Obj_t *pVVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  *ppThis0 = (Vta_Obj_t *)0x0;
  *ppThis1 = (Vta_Obj_t *)0x0;
  pGVar3 = p->pGia;
  uVar4 = *(ulong *)pObj;
  uVar9 = (uint)uVar4;
  uVar8 = uVar9 & 0x9fffffff;
  uVar7 = (uint)(uVar4 >> 0x20);
  if ((uVar8 == 0x9fffffff) && ((int)(uVar7 & 0x1fffffff) < pGVar3->vCis->nSize - pGVar3->nRegs)) {
    __assert_fail("!Gia_ObjIsPi(p->pGia, pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                  ,0x1bc,
                  "void Vta_ObjPreds(Vta_Man_t *, Vta_Obj_t *, Gia_Obj_t *, Vta_Obj_t **, Vta_Obj_t **)"
                 );
  }
  if (((~uVar4 & 0x1fffffff1fffffff) != 0) && ((uVar8 != 0x9fffffff || (pThis->iFrame != 0)))) {
    if ((~uVar9 & 0x1fffffff) != 0 && -1 < (int)uVar9) {
      pGVar5 = pGVar3->pObjs;
      if ((pGVar5 <= pObj) && (pObj < pGVar5 + pGVar3->nObjs)) {
        pVVar6 = Vga_ManFind(p,(int)((ulong)((long)pObj - (long)pGVar5) >> 2) * -0x55555555 -
                               (uVar9 & 0x1fffffff),pThis->iFrame);
        *ppThis0 = pVVar6;
        pGVar5 = p->pGia->pObjs;
        if ((pGVar5 <= pObj) && (pObj < pGVar5 + p->pGia->nObjs)) {
          pVVar6 = Vga_ManFind(p,(int)((ulong)((long)pObj - (long)pGVar5) >> 2) * -0x55555555 -
                                 (*(uint *)&pObj->field_0x4 & 0x1fffffff),pThis->iFrame);
          *ppThis1 = pVVar6;
          return;
        }
      }
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (((uVar8 != 0x9fffffff) || ((int)(uVar7 & 0x1fffffff) < pGVar3->vCis->nSize - pGVar3->nRegs))
       || (pThis->iFrame < 1)) {
      __assert_fail("Gia_ObjIsRo(p->pGia, pObj) && pThis->iFrame > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                    ,0x1c6,
                    "void Vta_ObjPreds(Vta_Man_t *, Vta_Obj_t *, Gia_Obj_t *, Vta_Obj_t **, Vta_Obj_t **)"
                   );
    }
    iVar1 = pGVar3->vCis->nSize;
    if ((int)(uVar7 & 0x1fffffff) < iVar1 - pGVar3->nRegs) {
      __assert_fail("Gia_ObjIsRo(p, pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1db,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar2 = pGVar3->vCos->nSize;
    uVar9 = (iVar2 - iVar1) + (uVar7 & 0x1fffffff);
    if (((int)uVar9 < 0) || (iVar2 <= (int)uVar9)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar1 = pGVar3->vCos->pArray[uVar9];
    if (((long)iVar1 < 0) || (pGVar3->nObjs <= iVar1)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pVVar6 = Vga_ManFind(p,iVar1 - (*(uint *)(pGVar3->pObjs + iVar1) & 0x1fffffff),
                         pThis->iFrame + -1);
    *ppThis0 = pVVar6;
  }
  return;
}

Assistant:

static inline void Vta_ObjPreds( Vta_Man_t * p, Vta_Obj_t * pThis, Gia_Obj_t * pObj, Vta_Obj_t ** ppThis0, Vta_Obj_t ** ppThis1 )
{
    *ppThis0 = NULL;
    *ppThis1 = NULL;
//    if ( !pThis->fAdded )
//        return;
    assert( !Gia_ObjIsPi(p->pGia, pObj) );
    if ( Gia_ObjIsConst0(pObj) || (Gia_ObjIsCi(pObj) && pThis->iFrame == 0) )
        return;
    if ( Gia_ObjIsAnd(pObj) )
    {
        *ppThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame );
        *ppThis1 = Vga_ManFind( p, Gia_ObjFaninId1p(p->pGia, pObj), pThis->iFrame );
//        assert( *ppThis0 && *ppThis1 );
        return;
    }
    assert( Gia_ObjIsRo(p->pGia, pObj) && pThis->iFrame > 0 );
    pObj = Gia_ObjRoToRi( p->pGia, pObj );
    *ppThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame-1 );
//    assert( *ppThis0 );
}